

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O0

void __thiscall test::OWDTimeStatistics::PrintStatistics(OWDTimeStatistics *this)

{
  double dVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  reference pvVar5;
  long in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  offset_t goalOffset_6;
  uint64_t percentile99;
  offset_t goalOffset_5;
  uint64_t percentile95;
  offset_t goalOffset_4;
  uint64_t percentile75;
  offset_t goalOffset_3;
  uint64_t percentile50;
  offset_t goalOffset_2;
  uint64_t percentile25;
  offset_t goalOffset_1;
  uint64_t percentile5;
  offset_t goalOffset;
  uint64_t percentile1;
  LogStringBuffer buffer_6;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer;
  LogStringBuffer buffer_3;
  char *in_stack_ffffffffffffe6d8;
  LogStringBuffer *in_stack_ffffffffffffe6e0;
  LogStringBuffer *in_stack_ffffffffffffe718;
  OutputWorker *in_stack_ffffffffffffe720;
  float local_1718;
  float local_1714;
  float local_1710;
  float local_170c;
  float local_1708;
  float local_1704;
  float local_1700 [2];
  long local_16f8;
  value_type_conflict local_16f0;
  long local_16e0;
  value_type_conflict local_16d8;
  long local_16c8;
  value_type_conflict local_16c0;
  long local_16b0;
  value_type_conflict local_16a8;
  long local_1698;
  value_type_conflict local_1690;
  long local_1680;
  value_type_conflict local_1678;
  long local_1668;
  value_type_conflict local_1660;
  char *local_1650;
  float *local_1648;
  char *local_1640;
  undefined8 *local_1638;
  char *local_1630;
  float *local_1628;
  char *local_1620;
  undefined8 *local_1618;
  char *local_1610;
  float *local_1608;
  char *local_1600;
  undefined8 *local_15f8;
  char *local_15f0;
  float *local_15e8;
  char *local_15e0;
  undefined8 *local_15d8;
  char *local_15d0;
  float *local_15c8;
  char *local_15c0;
  undefined8 *local_15b8;
  char *local_15b0;
  float *local_15a8;
  char *local_15a0;
  undefined8 *local_1598;
  char *local_1590;
  float *local_1588;
  char *local_1580;
  undefined8 *local_1578;
  char *local_1570;
  float *local_1568;
  char *local_1560;
  undefined4 local_1554;
  undefined8 *local_1550;
  undefined4 local_1544;
  undefined8 *local_1540;
  char *local_1538;
  float *local_1530;
  char *local_1528;
  undefined4 local_151c;
  undefined8 *local_1518;
  undefined4 local_150c;
  undefined8 *local_1508;
  char *local_1500;
  float *local_14f8;
  char *local_14f0;
  undefined4 local_14e4;
  undefined8 *local_14e0;
  undefined4 local_14d4;
  undefined8 *local_14d0;
  char *local_14c8;
  float *local_14c0;
  char *local_14b8;
  undefined4 local_14ac;
  undefined8 *local_14a8;
  undefined4 local_149c;
  undefined8 *local_1498;
  char *local_1490;
  float *local_1488;
  char *local_1480;
  undefined4 local_1474;
  undefined8 *local_1470;
  undefined4 local_1464;
  undefined8 *local_1460;
  char *local_1458;
  float *local_1450;
  char *local_1448;
  undefined4 local_143c;
  undefined8 *local_1438;
  undefined4 local_142c;
  undefined8 *local_1428;
  undefined1 local_1410 [16];
  ostream aoStack_1400 [376];
  char *local_1288;
  float *local_1280;
  char *local_1278;
  undefined4 local_126c;
  undefined8 *local_1268;
  undefined1 local_1250 [16];
  ostream aoStack_1240 [376];
  char *local_10c8;
  float *local_10c0;
  char *local_10b8;
  undefined4 local_10ac;
  undefined8 *local_10a8;
  undefined1 local_1090 [16];
  ostream aoStack_1080 [376];
  char *local_f08;
  float *local_f00;
  char *local_ef8;
  undefined4 local_eec;
  undefined8 *local_ee8;
  undefined1 local_ed0 [16];
  ostream aoStack_ec0 [376];
  char *local_d48;
  float *local_d40;
  char *local_d38;
  undefined4 local_d2c;
  undefined8 *local_d28;
  undefined1 local_d10 [16];
  ostream aoStack_d00 [376];
  char *local_b88;
  float *local_b80;
  char *local_b78;
  undefined4 local_b6c;
  undefined8 *local_b68;
  undefined1 local_b50 [16];
  ostream aoStack_b40 [376];
  char *local_9c8;
  float *local_9c0;
  char *local_9b8;
  undefined4 local_9ac;
  undefined8 *local_9a8;
  char *local_9a0;
  float *local_998;
  char *local_990;
  undefined *local_988;
  undefined1 *local_980;
  undefined8 *local_978;
  undefined *local_970;
  undefined1 *local_968;
  undefined8 *local_960;
  undefined *local_958;
  undefined1 *local_950;
  char *local_948;
  float *local_940;
  char *local_938;
  undefined *local_930;
  undefined1 *local_928;
  undefined8 *local_920;
  undefined *local_918;
  undefined1 *local_910;
  undefined8 *local_908;
  undefined *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  float *local_8e8;
  char *local_8e0;
  undefined *local_8d8;
  undefined1 *local_8d0;
  undefined8 *local_8c8;
  undefined *local_8c0;
  undefined1 *local_8b8;
  undefined8 *local_8b0;
  undefined *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  float *local_890;
  char *local_888;
  undefined *local_880;
  undefined1 *local_878;
  undefined8 *local_870;
  undefined *local_868;
  undefined1 *local_860;
  undefined8 *local_858;
  undefined *local_850;
  undefined1 *local_848;
  char *local_840;
  float *local_838;
  char *local_830;
  undefined *local_828;
  undefined1 *local_820;
  undefined8 *local_818;
  undefined *local_810;
  undefined1 *local_808;
  undefined8 *local_800;
  undefined *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  float *local_7e0;
  char *local_7d8;
  undefined *local_7d0;
  undefined1 *local_7c8;
  undefined8 *local_7c0;
  undefined *local_7b8;
  undefined1 *local_7b0;
  undefined8 *local_7a8;
  undefined *local_7a0;
  undefined1 *local_798;
  char *local_790;
  float *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined8 *local_770;
  char *local_768;
  float *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined8 *local_748;
  char *local_740;
  float *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined8 *local_720;
  char *local_718;
  float *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined8 *local_6f8;
  char *local_6f0;
  float *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined8 *local_6d0;
  char *local_6c8;
  float *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined8 *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined8 *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined8 *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined8 *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined8 *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined8 *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined8 *local_618;
  char *local_610;
  float *local_608;
  undefined1 *local_600;
  undefined8 *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined8 *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  float *local_5c8;
  undefined1 *local_5c0;
  undefined8 *local_5b8;
  float *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  float *local_598;
  undefined1 *local_590;
  undefined8 *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined8 *local_570;
  char *local_568;
  undefined1 *local_560;
  float *local_558;
  undefined1 *local_550;
  undefined8 *local_548;
  float *local_540;
  undefined1 *local_538;
  char *local_530;
  float *local_528;
  undefined1 *local_520;
  undefined8 *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined8 *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  float *local_4e8;
  undefined1 *local_4e0;
  undefined8 *local_4d8;
  float *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  float *local_4b8;
  undefined1 *local_4b0;
  undefined8 *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined8 *local_490;
  char *local_488;
  undefined1 *local_480;
  float *local_478;
  undefined1 *local_470;
  undefined8 *local_468;
  float *local_460;
  undefined1 *local_458;
  char *local_450;
  float *local_448;
  undefined1 *local_440;
  undefined8 *local_438;
  char *local_430;
  undefined1 *local_428;
  OutputWorker *local_420;
  char *local_418;
  undefined1 *local_410;
  float *local_408;
  undefined1 *local_400;
  undefined8 *local_3f8;
  float *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  float *local_3d8;
  undefined1 *local_3d0;
  undefined8 *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined8 *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  float *local_398;
  undefined1 *local_390;
  undefined8 *local_388;
  float *local_380;
  undefined1 *local_378;
  char *local_370;
  undefined1 *local_368;
  char *local_360;
  undefined1 *local_358;
  char *local_350;
  undefined1 *local_348;
  char *local_340;
  undefined1 *local_338;
  char *local_330;
  undefined1 *local_328;
  char *local_320;
  undefined1 *local_318;
  char *local_310;
  float *local_308;
  char *local_300;
  undefined4 local_2f4;
  undefined8 *local_2f0;
  undefined4 local_2e4;
  undefined8 *local_2e0;
  undefined1 local_2c8 [16];
  ostream aoStack_2b8 [376];
  char *local_140;
  float *local_138;
  char *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  char *local_118;
  float *local_110;
  char *local_108;
  undefined *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  undefined *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  undefined *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  float *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  char *local_80;
  undefined1 *local_78;
  char *local_70;
  float *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  float *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  float *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  char *local_10;
  undefined1 *local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  auVar13 = in_ZMM0._0_16_;
  local_1660 = 0;
  if (200 < *(uint *)(in_RDI + 8000)) {
    auVar13 = vcvtusi2sd_avx512f(auVar13,*(undefined4 *)(in_RDI + 8000));
    dVar1 = auVar13._0_8_ * 0.99;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1;
    local_1668 = vcvttsd2usi_avx512f(auVar6);
    pvVar2 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x11340c);
    pvVar3 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x113421);
    pvVar3 = pvVar3 + local_1668;
    pvVar4 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x113445);
    std::nth_element<unsigned_long*,test::OWDTimeStatistics::PrintStatistics()::__0>
              (pvVar2,pvVar3,pvVar4 + *(uint *)(in_RDI + 8000));
    pvVar5 = std::array<unsigned_long,_1000UL>::operator[]
                       ((array<unsigned_long,_1000UL> *)in_stack_ffffffffffffe6e0,
                        (size_type)in_stack_ffffffffffffe6d8);
    local_1660 = *pvVar5;
  }
  local_1678 = 0;
  if (100 < *(uint *)(in_RDI + 8000)) {
    auVar13 = vcvtusi2sd_avx512f(auVar13,*(undefined4 *)(in_RDI + 8000));
    dVar1 = auVar13._0_8_ * 0.95;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1;
    local_1680 = vcvttsd2usi_avx512f(auVar7);
    pvVar2 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1134e4);
    pvVar3 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1134f9);
    pvVar3 = pvVar3 + local_1680;
    pvVar4 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x11351d);
    std::nth_element<unsigned_long*,test::OWDTimeStatistics::PrintStatistics()::__1>
              (pvVar2,pvVar3,pvVar4 + *(uint *)(in_RDI + 8000));
    pvVar5 = std::array<unsigned_long,_1000UL>::operator[]
                       ((array<unsigned_long,_1000UL> *)in_stack_ffffffffffffe6e0,
                        (size_type)in_stack_ffffffffffffe6d8);
    local_1678 = *pvVar5;
  }
  local_1690 = 0;
  if (4 < *(uint *)(in_RDI + 8000)) {
    auVar13 = vcvtusi2sd_avx512f(auVar13,*(undefined4 *)(in_RDI + 8000));
    dVar1 = auVar13._0_8_ * 0.75;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1;
    local_1698 = vcvttsd2usi_avx512f(auVar8);
    pvVar2 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1135bc);
    pvVar3 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1135d1);
    pvVar3 = pvVar3 + local_1698;
    pvVar4 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1135f5);
    std::nth_element<unsigned_long*,test::OWDTimeStatistics::PrintStatistics()::__2>
              (pvVar2,pvVar3,pvVar4 + *(uint *)(in_RDI + 8000));
    pvVar5 = std::array<unsigned_long,_1000UL>::operator[]
                       ((array<unsigned_long,_1000UL> *)in_stack_ffffffffffffe6e0,
                        (size_type)in_stack_ffffffffffffe6d8);
    local_1690 = *pvVar5;
  }
  local_16a8 = 0;
  if (4 < *(uint *)(in_RDI + 8000)) {
    auVar13 = vcvtusi2sd_avx512f(auVar13,*(undefined4 *)(in_RDI + 8000));
    dVar1 = auVar13._0_8_ * 0.5;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    local_16b0 = vcvttsd2usi_avx512f(auVar9);
    pvVar2 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x113694);
    pvVar3 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1136a9);
    pvVar3 = pvVar3 + local_16b0;
    pvVar4 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1136cd);
    std::nth_element<unsigned_long*,test::OWDTimeStatistics::PrintStatistics()::__3>
              (pvVar2,pvVar3,pvVar4 + *(uint *)(in_RDI + 8000));
    pvVar5 = std::array<unsigned_long,_1000UL>::operator[]
                       ((array<unsigned_long,_1000UL> *)in_stack_ffffffffffffe6e0,
                        (size_type)in_stack_ffffffffffffe6d8);
    local_16a8 = *pvVar5;
  }
  local_16c0 = 0;
  if (8 < *(uint *)(in_RDI + 8000)) {
    auVar13 = vcvtusi2sd_avx512f(auVar13,*(undefined4 *)(in_RDI + 8000));
    dVar1 = auVar13._0_8_ * 0.25;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    local_16c8 = vcvttsd2usi_avx512f(auVar10);
    pvVar2 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x11376c);
    pvVar3 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x113781);
    pvVar3 = pvVar3 + local_16c8;
    pvVar4 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1137a5);
    std::nth_element<unsigned_long*,test::OWDTimeStatistics::PrintStatistics()::__4>
              (pvVar2,pvVar3,pvVar4 + *(uint *)(in_RDI + 8000));
    pvVar5 = std::array<unsigned_long,_1000UL>::operator[]
                       ((array<unsigned_long,_1000UL> *)in_stack_ffffffffffffe6e0,
                        (size_type)in_stack_ffffffffffffe6d8);
    local_16c0 = *pvVar5;
  }
  local_16d8 = 0;
  if (0x28 < *(uint *)(in_RDI + 8000)) {
    auVar13 = vcvtusi2sd_avx512f(auVar13,*(undefined4 *)(in_RDI + 8000));
    dVar1 = auVar13._0_8_ * 0.05;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1;
    local_16e0 = vcvttsd2usi_avx512f(auVar11);
    pvVar2 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x113844);
    pvVar3 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x113859);
    pvVar3 = pvVar3 + local_16e0;
    pvVar4 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x11387d);
    std::nth_element<unsigned_long*,test::OWDTimeStatistics::PrintStatistics()::__5>
              (pvVar2,pvVar3,pvVar4 + *(uint *)(in_RDI + 8000));
    pvVar5 = std::array<unsigned_long,_1000UL>::operator[]
                       ((array<unsigned_long,_1000UL> *)in_stack_ffffffffffffe6e0,
                        (size_type)in_stack_ffffffffffffe6d8);
    local_16d8 = *pvVar5;
  }
  local_16f0 = 0;
  if (200 < *(uint *)(in_RDI + 8000)) {
    auVar13 = vcvtusi2sd_avx512f(auVar13,*(undefined4 *)(in_RDI + 8000));
    dVar1 = auVar13._0_8_ * 0.01;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1;
    local_16f8 = vcvttsd2usi_avx512f(auVar12);
    pvVar2 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x11391f);
    pvVar3 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x113934);
    pvVar3 = pvVar3 + local_16f8;
    pvVar4 = std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x113958);
    std::nth_element<unsigned_long*,test::OWDTimeStatistics::PrintStatistics()::__6>
              (pvVar2,pvVar3,pvVar4 + *(uint *)(in_RDI + 8000));
    pvVar5 = std::array<unsigned_long,_1000UL>::operator[]
                       ((array<unsigned_long,_1000UL> *)in_stack_ffffffffffffe6e0,
                        (size_type)in_stack_ffffffffffffe6d8);
    local_16f0 = *pvVar5;
  }
  auVar13 = vcvtusi2ss_avx512f(auVar13,local_1660);
  auVar14._0_4_ = auVar13._0_4_ / 1000.0;
  auVar14._4_12_ = auVar13._4_12_;
  local_1598 = &Logger;
  local_15a0 = "One-way  1% percentile latency = ";
  local_15a8 = local_1700;
  local_15b0 = " msec";
  local_1550 = &Logger;
  local_1554 = 2;
  local_1560 = "One-way  1% percentile latency = ";
  local_1570 = " msec";
  local_1540 = &Logger;
  local_1544 = 2;
  local_1700[0] = auVar14._0_4_;
  local_1568 = local_15a8;
  if (DAT_00129388 < 3) {
    local_9a8 = &Logger;
    local_9ac = 2;
    local_9b8 = "One-way  1% percentile latency = ";
    local_9c8 = " msec";
    local_9c0 = local_15a8;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,Trace);
    local_988 = &DAT_001293b8;
    local_978 = &Logger;
    local_990 = local_9b8;
    local_998 = local_9c0;
    local_9a0 = local_9c8;
    local_960 = &Logger;
    local_980 = local_b50;
    local_970 = local_988;
    local_968 = local_b50;
    local_958 = local_988;
    local_950 = local_b50;
    std::operator<<(aoStack_b40,(string *)&DAT_001293b8);
    local_6a8 = &Logger;
    local_6b0 = local_980;
    local_6b8 = local_990;
    local_6c0 = local_998;
    local_6c8 = local_9a0;
    local_690 = &Logger;
    local_698 = local_980;
    local_6a0 = local_990;
    local_318 = local_980;
    local_320 = local_990;
    std::operator<<((ostream *)(local_980 + 0x10),local_990);
    local_5f8 = &Logger;
    local_600 = local_6b0;
    local_608 = local_6c0;
    local_610 = local_6c8;
    local_5b8 = &Logger;
    local_5c0 = local_6b0;
    local_5c8 = local_6c0;
    local_5a8 = local_6b0;
    local_5b0 = local_6c0;
    auVar20._0_8_ = std::ostream::operator<<((ostream *)(local_6b0 + 0x10),*local_6c0);
    auVar20._8_56_ = extraout_var;
    auVar14 = auVar20._0_16_;
    local_5e0 = &Logger;
    local_5e8 = local_600;
    local_5f0 = local_610;
    local_5d0 = local_600;
    local_5d8 = local_610;
    std::operator<<((ostream *)(local_600 + 0x10),local_610);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x113e2f);
  }
  auVar13 = vcvtusi2ss_avx512f(auVar14,local_1678);
  auVar15._0_4_ = auVar13._0_4_ / 1000.0;
  auVar15._4_12_ = auVar13._4_12_;
  local_15b8 = &Logger;
  local_15c0 = "One-way  5% percentile latency = ";
  local_15c8 = &local_1704;
  local_15d0 = " msec";
  local_1518 = &Logger;
  local_151c = 2;
  local_1528 = "One-way  5% percentile latency = ";
  local_1538 = " msec";
  local_1508 = &Logger;
  local_150c = 2;
  local_1704 = auVar15._0_4_;
  local_1530 = local_15c8;
  if (DAT_00129388 < 3) {
    local_b68 = &Logger;
    local_b6c = 2;
    local_b78 = "One-way  5% percentile latency = ";
    local_b88 = " msec";
    local_b80 = local_15c8;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,Trace);
    local_930 = &DAT_001293b8;
    local_920 = &Logger;
    local_938 = local_b78;
    local_940 = local_b80;
    local_948 = local_b88;
    local_908 = &Logger;
    local_928 = local_d10;
    local_918 = local_930;
    local_910 = local_d10;
    local_900 = local_930;
    local_8f8 = local_d10;
    std::operator<<(aoStack_d00,(string *)&DAT_001293b8);
    local_6d0 = &Logger;
    local_6d8 = local_928;
    local_6e0 = local_938;
    local_6e8 = local_940;
    local_6f0 = local_948;
    local_678 = &Logger;
    local_680 = local_928;
    local_688 = local_938;
    local_328 = local_928;
    local_330 = local_938;
    std::operator<<((ostream *)(local_928 + 0x10),local_938);
    local_588 = &Logger;
    local_590 = local_6d8;
    local_598 = local_6e8;
    local_5a0 = local_6f0;
    local_548 = &Logger;
    local_550 = local_6d8;
    local_558 = local_6e8;
    local_538 = local_6d8;
    local_540 = local_6e8;
    auVar21._0_8_ = std::ostream::operator<<((ostream *)(local_6d8 + 0x10),*local_6e8);
    auVar21._8_56_ = extraout_var_00;
    auVar15 = auVar21._0_16_;
    local_570 = &Logger;
    local_578 = local_590;
    local_580 = local_5a0;
    local_560 = local_590;
    local_568 = local_5a0;
    std::operator<<((ostream *)(local_590 + 0x10),local_5a0);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1142b9);
  }
  auVar13 = vcvtusi2ss_avx512f(auVar15,local_1690);
  auVar16._0_4_ = auVar13._0_4_ / 1000.0;
  auVar16._4_12_ = auVar13._4_12_;
  local_15d8 = &Logger;
  local_15e0 = "One-way 25% percentile latency = ";
  local_15e8 = &local_1708;
  local_15f0 = " msec";
  local_14e0 = &Logger;
  local_14e4 = 2;
  local_14f0 = "One-way 25% percentile latency = ";
  local_1500 = " msec";
  local_14d0 = &Logger;
  local_14d4 = 2;
  local_1708 = auVar16._0_4_;
  local_14f8 = local_15e8;
  if (DAT_00129388 < 3) {
    local_d28 = &Logger;
    local_d2c = 2;
    local_d38 = "One-way 25% percentile latency = ";
    local_d48 = " msec";
    local_d40 = local_15e8;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,Trace);
    local_8d8 = &DAT_001293b8;
    local_8c8 = &Logger;
    local_8e0 = local_d38;
    local_8e8 = local_d40;
    local_8f0 = local_d48;
    local_8b0 = &Logger;
    local_8d0 = local_ed0;
    local_8c0 = local_8d8;
    local_8b8 = local_ed0;
    local_8a8 = local_8d8;
    local_8a0 = local_ed0;
    std::operator<<(aoStack_ec0,(string *)&DAT_001293b8);
    local_6f8 = &Logger;
    local_700 = local_8d0;
    local_708 = local_8e0;
    local_710 = local_8e8;
    local_718 = local_8f0;
    local_660 = &Logger;
    local_668 = local_8d0;
    local_670 = local_8e0;
    local_338 = local_8d0;
    local_340 = local_8e0;
    std::operator<<((ostream *)(local_8d0 + 0x10),local_8e0);
    local_518 = &Logger;
    local_520 = local_700;
    local_528 = local_710;
    local_530 = local_718;
    local_4d8 = &Logger;
    local_4e0 = local_700;
    local_4e8 = local_710;
    local_4c8 = local_700;
    local_4d0 = local_710;
    auVar22._0_8_ = std::ostream::operator<<((ostream *)(local_700 + 0x10),*local_710);
    auVar22._8_56_ = extraout_var_01;
    auVar16 = auVar22._0_16_;
    local_500 = &Logger;
    local_508 = local_520;
    local_510 = local_530;
    local_4f0 = local_520;
    local_4f8 = local_530;
    std::operator<<((ostream *)(local_520 + 0x10),local_530);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x114743);
  }
  auVar13 = vcvtusi2ss_avx512f(auVar16,local_16a8);
  auVar17._0_4_ = auVar13._0_4_ / 1000.0;
  auVar17._4_12_ = auVar13._4_12_;
  local_1578 = &Logger;
  local_1580 = "One-way 50% percentile latency = ";
  local_1588 = &local_170c;
  local_1590 = " msec (median)";
  local_2f0 = &Logger;
  local_2f4 = 2;
  local_300 = "One-way 50% percentile latency = ";
  local_310 = " msec (median)";
  local_2e0 = &Logger;
  local_2e4 = 2;
  local_170c = auVar17._0_4_;
  local_308 = local_1588;
  if (DAT_00129388 < 3) {
    local_120 = &Logger;
    local_124 = 2;
    local_130 = "One-way 50% percentile latency = ";
    local_140 = " msec (median)";
    local_138 = local_1588;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,Trace);
    local_100 = &DAT_001293b8;
    local_f0 = &Logger;
    local_108 = local_130;
    local_110 = local_138;
    local_118 = local_140;
    local_d8 = &Logger;
    local_f8 = local_2c8;
    local_e8 = local_100;
    local_e0 = local_2c8;
    local_d0 = local_100;
    local_c8 = local_2c8;
    std::operator<<(aoStack_2b8,(string *)&DAT_001293b8);
    local_a0 = &Logger;
    local_a8 = local_f8;
    local_b0 = local_108;
    local_b8 = local_110;
    local_c0 = local_118;
    local_88 = &Logger;
    local_90 = local_f8;
    local_98 = local_108;
    local_78 = local_f8;
    local_80 = local_108;
    std::operator<<((ostream *)(local_f8 + 0x10),local_108);
    local_58 = &Logger;
    local_60 = local_a8;
    local_68 = local_b8;
    local_70 = local_c0;
    local_40 = &Logger;
    local_48 = local_a8;
    local_50 = local_b8;
    local_30 = local_a8;
    local_38 = local_b8;
    auVar23._0_8_ = std::ostream::operator<<((ostream *)(local_a8 + 0x10),*local_b8);
    auVar23._8_56_ = extraout_var_02;
    auVar17 = auVar23._0_16_;
    local_18 = &Logger;
    local_20 = local_60;
    local_28 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x114bcd);
  }
  auVar13 = vcvtusi2ss_avx512f(auVar17,local_16c0);
  auVar18._0_4_ = auVar13._0_4_ / 1000.0;
  auVar18._4_12_ = auVar13._4_12_;
  local_15f8 = &Logger;
  local_1600 = "One-way 75% percentile latency = ";
  local_1608 = &local_1710;
  local_1610 = " msec";
  local_14a8 = &Logger;
  local_14ac = 2;
  local_14b8 = "One-way 75% percentile latency = ";
  local_14c8 = " msec";
  local_1498 = &Logger;
  local_149c = 2;
  local_1710 = auVar18._0_4_;
  local_14c0 = local_1608;
  if (DAT_00129388 < 3) {
    local_ee8 = &Logger;
    local_eec = 2;
    local_ef8 = "One-way 75% percentile latency = ";
    local_f08 = " msec";
    local_f00 = local_1608;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,Trace);
    local_880 = &DAT_001293b8;
    local_870 = &Logger;
    local_888 = local_ef8;
    local_890 = local_f00;
    local_898 = local_f08;
    local_858 = &Logger;
    local_878 = local_1090;
    local_868 = local_880;
    local_860 = local_1090;
    local_850 = local_880;
    local_848 = local_1090;
    std::operator<<(aoStack_1080,(string *)&DAT_001293b8);
    local_720 = &Logger;
    local_728 = local_878;
    local_730 = local_888;
    local_738 = local_890;
    local_740 = local_898;
    local_648 = &Logger;
    local_650 = local_878;
    local_658 = local_888;
    local_348 = local_878;
    local_350 = local_888;
    std::operator<<((ostream *)(local_878 + 0x10),local_888);
    local_4a8 = &Logger;
    local_4b0 = local_728;
    local_4b8 = local_738;
    local_4c0 = local_740;
    local_468 = &Logger;
    local_470 = local_728;
    local_478 = local_738;
    local_458 = local_728;
    local_460 = local_738;
    auVar24._0_8_ = std::ostream::operator<<((ostream *)(local_728 + 0x10),*local_738);
    auVar24._8_56_ = extraout_var_03;
    auVar18 = auVar24._0_16_;
    local_490 = &Logger;
    local_498 = local_4b0;
    local_4a0 = local_4c0;
    local_480 = local_4b0;
    local_488 = local_4c0;
    std::operator<<((ostream *)(local_4b0 + 0x10),local_4c0);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x115051);
  }
  auVar13 = vcvtusi2ss_avx512f(auVar18,local_16d8);
  auVar19._0_4_ = auVar13._0_4_ / 1000.0;
  auVar19._4_12_ = auVar13._4_12_;
  local_1618 = &Logger;
  local_1620 = "One-way 95% percentile latency = ";
  local_1628 = &local_1714;
  local_1630 = " msec";
  local_1470 = &Logger;
  local_1474 = 2;
  local_1480 = "One-way 95% percentile latency = ";
  local_1490 = " msec";
  local_1460 = &Logger;
  local_1464 = 2;
  local_1714 = auVar19._0_4_;
  local_1488 = local_1628;
  if (DAT_00129388 < 3) {
    local_10a8 = &Logger;
    local_10ac = 2;
    local_10b8 = "One-way 95% percentile latency = ";
    local_10c8 = " msec";
    local_10c0 = local_1628;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,Trace);
    local_828 = &DAT_001293b8;
    local_818 = &Logger;
    local_830 = local_10b8;
    local_838 = local_10c0;
    local_840 = local_10c8;
    local_800 = &Logger;
    local_820 = local_1250;
    local_810 = local_828;
    local_808 = local_1250;
    local_7f8 = local_828;
    local_7f0 = local_1250;
    std::operator<<(aoStack_1240,(string *)&DAT_001293b8);
    local_748 = &Logger;
    local_750 = local_820;
    local_758 = local_830;
    local_760 = local_838;
    local_768 = local_840;
    local_630 = &Logger;
    local_638 = local_820;
    local_640 = local_830;
    local_358 = local_820;
    local_360 = local_830;
    std::operator<<((ostream *)(local_820 + 0x10),local_830);
    local_438 = &Logger;
    local_440 = local_750;
    local_448 = local_760;
    local_450 = local_768;
    in_stack_ffffffffffffe720 = (OutputWorker *)&Logger;
    local_3f8 = &Logger;
    local_400 = local_750;
    local_408 = local_760;
    local_3e8 = local_750;
    local_3f0 = local_760;
    auVar25._0_8_ = std::ostream::operator<<((ostream *)(local_750 + 0x10),*local_760);
    auVar25._8_56_ = extraout_var_04;
    auVar19 = auVar25._0_16_;
    local_428 = local_440;
    local_430 = local_450;
    local_410 = local_440;
    local_418 = local_450;
    local_420 = in_stack_ffffffffffffe720;
    std::operator<<((ostream *)(local_440 + 0x10),local_450);
    in_stack_ffffffffffffe718 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1154b1);
  }
  auVar13 = vcvtusi2ss_avx512f(auVar19,local_16f0);
  local_1718 = auVar13._0_4_ / 1000.0;
  local_1638 = &Logger;
  local_1640 = "One-way 99% percentile latency = ";
  local_1648 = &local_1718;
  local_1650 = " msec";
  local_1438 = &Logger;
  local_143c = 2;
  local_1448 = "One-way 99% percentile latency = ";
  local_1458 = " msec";
  local_1428 = &Logger;
  local_142c = 2;
  if (DAT_00129388 < 3) {
    local_1268 = &Logger;
    local_126c = 2;
    local_1278 = "One-way 99% percentile latency = ";
    local_1288 = " msec";
    local_1450 = local_1648;
    local_1280 = local_1648;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,Trace);
    local_7d0 = &DAT_001293b8;
    local_7c0 = &Logger;
    local_7d8 = local_1278;
    local_7e0 = local_1280;
    local_7e8 = local_1288;
    local_7a8 = &Logger;
    local_7c8 = local_1410;
    local_7b8 = local_7d0;
    local_7b0 = local_1410;
    local_7a0 = local_7d0;
    local_798 = local_1410;
    std::operator<<(aoStack_1400,(string *)&DAT_001293b8);
    local_770 = &Logger;
    local_778 = local_7c8;
    local_780 = local_7d8;
    local_788 = local_7e0;
    local_790 = local_7e8;
    local_618 = &Logger;
    local_620 = local_7c8;
    local_628 = local_7d8;
    local_368 = local_7c8;
    local_370 = local_7d8;
    std::operator<<((ostream *)(local_7c8 + 0x10),local_7d8);
    local_3c8 = &Logger;
    local_3d0 = local_778;
    local_3d8 = local_788;
    local_3e0 = local_790;
    local_388 = &Logger;
    local_390 = local_778;
    local_398 = local_788;
    local_378 = local_778;
    local_380 = local_788;
    std::ostream::operator<<((ostream *)(local_778 + 0x10),*local_788);
    local_3b0 = &Logger;
    local_3b8 = local_3d0;
    local_3c0 = local_3e0;
    local_3a0 = local_3d0;
    local_3a8 = local_3e0;
    std::operator<<((ostream *)(local_3d0 + 0x10),local_3e0);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x11590e);
  }
  return;
}

Assistant:

void OWDTimeStatistics::PrintStatistics()
{
    uint64_t percentile1 = 0;
    if (SampleCount > 200)
    {
        offset_t goalOffset = (offset_t)(0.99 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile1 = Samples[goalOffset];
    }

    uint64_t percentile5 = 0;
    if (SampleCount > 100)
    {
        offset_t goalOffset = (offset_t)(0.95 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile5 = Samples[goalOffset];
    }

    uint64_t percentile25 = 0;
    if (SampleCount > 4)
    {
        offset_t goalOffset = (offset_t)(0.75 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile25 = Samples[goalOffset];
    }

    uint64_t percentile50 = 0;
    if (SampleCount > 4)
    {
        offset_t goalOffset = (offset_t)(0.5 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile50 = Samples[goalOffset];
    }

    uint64_t percentile75 = 0;
    if (SampleCount > 8)
    {
        offset_t goalOffset = (offset_t)(0.25 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile75 = Samples[goalOffset];
    }

    uint64_t percentile95 = 0;
    if (SampleCount > 40)
    {
        offset_t goalOffset = (offset_t)(0.05 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile95 = Samples[goalOffset];
    }

    uint64_t percentile99 = 0;
    if (SampleCount > 200)
    {
        offset_t goalOffset = (offset_t)(0.01 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile99 = Samples[goalOffset];
    }

    Logger.Info("One-way  1% percentile latency = ", percentile1 / 1000.f, " msec");
    Logger.Info("One-way  5% percentile latency = ", percentile5 / 1000.f, " msec");
    Logger.Info("One-way 25% percentile latency = ", percentile25 / 1000.f, " msec");
    Logger.Info("One-way 50% percentile latency = ", percentile50 / 1000.f, " msec (median)");
    Logger.Info("One-way 75% percentile latency = ", percentile75 / 1000.f, " msec");
    Logger.Info("One-way 95% percentile latency = ", percentile95 / 1000.f, " msec");
    Logger.Info("One-way 99% percentile latency = ", percentile99 / 1000.f, " msec");
}